

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_create_artifact(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t ind;
  char s [80];
  char prompt [80];
  object *in_stack_ffffffffffffff38;
  wchar_t local_bc;
  char local_b8 [160];
  
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"index",&local_bc);
  if (wVar2 != L'\0') {
    local_b8[0x40] = '\0';
    local_b8[0x41] = '\0';
    local_b8[0x42] = '\0';
    local_b8[0x43] = '\0';
    local_b8[0x44] = '\0';
    local_b8[0x45] = '\0';
    local_b8[0x46] = '\0';
    local_b8[0x47] = '\0';
    local_b8[0x48] = '\0';
    local_b8[0x49] = '\0';
    local_b8[0x4a] = '\0';
    local_b8[0x4b] = '\0';
    local_b8[0x4c] = '\0';
    local_b8[0x4d] = '\0';
    local_b8[0x4e] = '\0';
    local_b8[0x4f] = '\0';
    local_b8[0x30] = '\0';
    local_b8[0x31] = '\0';
    local_b8[0x32] = '\0';
    local_b8[0x33] = '\0';
    local_b8[0x34] = '\0';
    local_b8[0x35] = '\0';
    local_b8[0x36] = '\0';
    local_b8[0x37] = '\0';
    local_b8[0x38] = '\0';
    local_b8[0x39] = '\0';
    local_b8[0x3a] = '\0';
    local_b8[0x3b] = '\0';
    local_b8[0x3c] = '\0';
    local_b8[0x3d] = '\0';
    local_b8[0x3e] = '\0';
    local_b8[0x3f] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    local_b8[0x28] = '\0';
    local_b8[0x29] = '\0';
    local_b8[0x2a] = '\0';
    local_b8[0x2b] = '\0';
    local_b8[0x2c] = '\0';
    local_b8[0x2d] = '\0';
    local_b8[0x2e] = '\0';
    local_b8[0x2f] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    strnfmt(local_b8 + 0x50,0x50,"Create which artifact (1-%d)? ",(ulong)(z_info->a_max - 1));
    _Var1 = get_string(local_b8 + 0x50,local_b8,0x50);
    if (!_Var1) {
      return;
    }
    _Var1 = get_int_from_string(local_b8,&local_bc);
    if (!_Var1) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"index",local_bc);
  }
  if (((long)local_bc < 1) || ((int)(uint)z_info->a_max <= local_bc)) {
    msg("That\'s not a valid artifact.");
  }
  else {
    wiz_create_object_from_artifact(a_info + local_bc);
    wiz_drop_object(in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void do_cmd_wiz_create_artifact(struct command *cmd)
{
	int ind;

	if (cmd_get_arg_number(cmd, "index", &ind) != CMD_OK) {
		char prompt[80];
		char s[80] = "";

		strnfmt(prompt, sizeof(prompt),
			"Create which artifact (1-%d)? ", z_info->a_max - 1);
		if (!get_string(prompt, s, sizeof(s))) return;
		if (!get_int_from_string(s, &ind)) return;
		cmd_set_arg_number(cmd, "index", ind);
	}

	if (ind >= 1 && ind < z_info->a_max) {
		struct artifact *art = &a_info[ind];
		struct object *obj = wiz_create_object_from_artifact(art);

		wiz_drop_object(obj);
	} else {
		msg("That's not a valid artifact.");
	}
}